

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O2

void __thiscall DPusher::Tick(DPusher *this)

{
  double *pdVar1;
  TObjPtr<AActor> *obj;
  uint uVar2;
  msecnode_t *pmVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  bool bVar7;
  sector_t *psVar8;
  AActor *pAVar9;
  AActor *pAVar10;
  PClass *pPVar11;
  msecnode_t **ppmVar12;
  sector_t *this_00;
  double dVar13;
  double dVar14;
  DAngle pushangle;
  DAngle local_240;
  FPortalGroupArray check;
  DVector2 pos;
  CheckResult cres;
  FMultiBlockThingsIterator it;
  
  if ((var_pushers.Value) && ((sectors[this->m_Affectee].Flags & 0x20) != 0)) {
    if (this->m_Type == p_push) {
      check.data.Array = (unsigned_short *)0x0;
      check.data.Most = 0;
      check.data.Count = 0;
      check._1_7_ = check._1_7_ & 0xffffff;
      check.varused = '\0';
      check._0_8_ = (ulong)(uint7)check._1_7_ << 8;
      obj = &this->m_Source;
      pAVar9 = GC::ReadBarrier<AActor>((AActor **)obj);
      FMultiBlockThingsIterator::FMultiBlockThingsIterator(&it,&check,pAVar9,this->m_Radius,false);
      while (bVar7 = FMultiBlockThingsIterator::Next(&it,&cres), pAVar9 = cres.thing, bVar7) {
        if ((((cres.thing)->flags2).Value & 2) == 0) {
          if ((compatflags.Value._3_1_ & 1) != 0) {
LAB_004c8cad:
            bVar7 = AActor::IsSentient(cres.thing);
            if ((bVar7) || (((pAVar9->flags).Value & 4) != 0)) {
LAB_004c8cc3:
              if ((pAVar9->player == (player_t *)0x0) || (((pAVar9->flags).Value & 0x200) == 0))
              goto LAB_004c8cd7;
            }
          }
        }
        else {
          uVar2 = ((cres.thing)->flags).Value;
          if ((compatflags.Value._3_1_ & 1) != 0) {
            if ((uVar2 >> 0xc & 1) != 0) goto LAB_004c8cad;
            goto LAB_004c8cc3;
          }
          if ((uVar2 >> 0xc & 1) == 0) {
LAB_004c8cd7:
            pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
            AActor::Vec2To((AActor *)&pos,pAVar10);
            dVar5 = TVector2<double>::Length((TVector2<double> *)&pos);
            dVar5 = (dVar5 * -0.5 + this->m_Magnitude) * 0.00390625;
            if (0.0 < dVar5) {
              pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
              bVar7 = P_CheckSight(pAVar9,pAVar10,1);
              if (bVar7) {
                TVector2<double>::Angle((TVector2<double> *)&pushangle);
                pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
                pPVar11 = DObject::GetClass((DObject *)pAVar10);
                if ((pPVar11->super_PStruct).super_PNamedType.TypeName.Index == 0x3d) {
                  pushangle.Degrees = pushangle.Degrees + 180.0;
                }
                local_240.Degrees = pushangle.Degrees;
                AActor::Thrust(pAVar9,&local_240,dVar5);
              }
            }
          }
        }
      }
      TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
                (&it.blockIterator.DynHash);
      TArray<unsigned_short,_unsigned_short>::~TArray(&check.data);
    }
    else {
      this_00 = sectors + this->m_Affectee;
      ppmVar12 = &this_00->touching_thinglist;
      while (pmVar3 = *ppmVar12, pmVar3 != (msecnode_t *)0x0) {
        pAVar9 = pmVar3->m_thing;
        if ((((pAVar9->flags2).Value & 2) != 0) && (((pAVar9->flags).Value & 0x1000) == 0)) {
          psVar8 = sector_t::GetHeightSec(this_00);
          AActor::PosRelative((DVector3 *)&it,pAVar9,this_00);
          if (this->m_Type == p_wind) {
            if (psVar8 == (sector_t *)0x0) {
              dVar5 = (pAVar9->__Pos).Z;
              if (pAVar9->floorz <= dVar5 && dVar5 != pAVar9->floorz) goto LAB_004c8bd3;
            }
            else {
              check._0_8_ = it.checklist;
              check.entry = (WORD  [4])it.checkpoint.X;
              dVar5 = secplane_t::ZatPoint(&psVar8->floorplane,(DVector2 *)&check);
              if (dVar5 < (pAVar9->__Pos).Z) {
LAB_004c8bd3:
                dVar13 = (this->m_PushVec).X;
                dVar14 = (this->m_PushVec).Y;
                goto LAB_004c8be7;
              }
              dVar13 = 0.0;
              dVar14 = 0.0;
              pdVar1 = &pAVar9->player->viewz;
              if (*pdVar1 <= dVar5 && dVar5 != *pdVar1) goto LAB_004c8be7;
            }
            dVar13 = (this->m_PushVec).X * 0.5;
            dVar14 = (this->m_PushVec).Y * 0.5;
          }
          else {
            if (psVar8 == (sector_t *)0x0) {
              psVar8 = this_00;
            }
            dVar5 = (pAVar9->__Pos).Z;
            check._0_8_ = it.checklist;
            check.entry = (WORD  [4])it.checkpoint.X;
            dVar6 = secplane_t::ZatPoint(&psVar8->floorplane,(DVector2 *)&check);
            dVar13 = 0.0;
            dVar14 = 0.0;
            if (dVar5 <= dVar6) goto LAB_004c8bd3;
          }
LAB_004c8be7:
          dVar5 = (pAVar9->Vel).X + dVar13 * 0.0078125;
          dVar6 = (pAVar9->Vel).Y + dVar14 * 0.0078125;
          auVar4._8_4_ = SUB84(dVar6,0);
          auVar4._0_8_ = dVar5;
          auVar4._12_4_ = (int)((ulong)dVar6 >> 0x20);
          (pAVar9->Vel).X = dVar5;
          (pAVar9->Vel).Y = (double)auVar4._8_8_;
        }
        ppmVar12 = &pmVar3->m_snext;
      }
    }
  }
  return;
}

Assistant:

void DPusher::Tick ()
{
	sector_t *sec;
	AActor *thing;
	msecnode_t *node;
	double ht;

	if (!var_pushers)
		return;

	sec = sectors + m_Affectee;

	// Be sure the special sector type is still turned on. If so, proceed.
	// Else, bail out; the sector type has been changed on us.

	if (!(sec->Flags & SECF_PUSH))
		return;

	// For constant pushers (wind/current) there are 3 situations:
	//
	// 1) Affected Thing is above the floor.
	//
	//    Apply the full force if wind, no force if current.
	//
	// 2) Affected Thing is on the ground.
	//
	//    Apply half force if wind, full force if current.
	//
	// 3) Affected Thing is below the ground (underwater effect).
	//
	//    Apply no force if wind, full force if current.
	//
	// Apply the effect to clipped players only for now.
	//
	// In Phase II, you can apply these effects to Things other than players.
	// [RH] No Phase II, but it works with anything having MF2_WINDTHRUST now.

	if (m_Type == p_push)
	{
		// Seek out all pushable things within the force radius of this
		// point pusher. Crosses sectors, so use blockmap.

		FPortalGroupArray check(FPortalGroupArray::PGA_NoSectorPortals);	// no sector portals because this thing is utterly z-unaware.
		FMultiBlockThingsIterator it(check, m_Source, m_Radius);
		FMultiBlockThingsIterator::CheckResult cres;


		while (it.Next(&cres))
		{
			AActor *thing = cres.thing;
			// Normal ZDoom is based only on the WINDTHRUST flag, with the noclip cheat as an exemption.
			bool pusharound = ((thing->flags2 & MF2_WINDTHRUST) && !(thing->flags & MF_NOCLIP));
					
			// MBF allows any sentient or shootable thing to be affected, but players with a fly cheat aren't.
			if (compatflags & COMPATF_MBFMONSTERMOVE)
			{
				pusharound = ((pusharound || (thing->IsSentient()) || (thing->flags & MF_SHOOTABLE)) // Add categories here
					&& (!(thing->player && (thing->flags & (MF_NOGRAVITY))))); // Exclude flying players here
			}

			if ((pusharound) )
			{
				DVector2 pos = m_Source->Vec2To(thing);
				double dist = pos.Length();
				double speed = (m_Magnitude - (dist/2)) / (PUSH_FACTOR * 2);

				// If speed <= 0, you're outside the effective radius. You also have
				// to be able to see the push/pull source point.

				if ((speed > 0) && (P_CheckSight (thing, m_Source, SF_IGNOREVISIBILITY)))
				{
					DAngle pushangle = pos.Angle();
					if (m_Source->GetClass()->TypeName == NAME_PointPuller) pushangle += 180;  
					thing->Thrust(pushangle, speed);
				}
			}
		}
		return;
	}

	// constant pushers p_wind and p_current

	node = sec->touching_thinglist; // things touching this sector
	for ( ; node ; node = node->m_snext)
	{
		thing = node->m_thing;
		if (!(thing->flags2 & MF2_WINDTHRUST) || (thing->flags & MF_NOCLIP))
			continue;

		sector_t *hsec = sec->GetHeightSec();
		DVector3 pos = thing->PosRelative(sec);
		DVector2 pushvel;
		if (m_Type == p_wind)
		{
			if (hsec == NULL)
			{ // NOT special water sector
				if (thing->Z() > thing->floorz) // above ground
				{
					pushvel = m_PushVec; // full force
				}
				else // on ground
				{
					pushvel = m_PushVec / 2; // half force
				}
			}
			else // special water sector
			{
				ht = hsec->floorplane.ZatPoint(pos);
				if (thing->Z() > ht) // above ground
				{
					pushvel = m_PushVec; // full force
				}
				else if (thing->player->viewz < ht) // underwater
				{
					pushvel.Zero(); // no force
				}
				else // wading in water
				{
					pushvel = m_PushVec / 2; // full force
				}
			}
		}
		else // p_current
		{
			const secplane_t *floor;

			if (hsec == NULL)
			{ // NOT special water sector
				floor = &sec->floorplane;
			}
			else
			{ // special water sector
				floor = &hsec->floorplane;
			}
			if (thing->Z() > floor->ZatPoint(pos))
			{ // above ground
				pushvel.Zero(); // no force
			}
			else
			{ // on ground/underwater
				pushvel = m_PushVec; // full force
			}
		}
		thing->Vel += pushvel / PUSH_FACTOR;
	}
}